

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result_conflict * __thiscall
CoreML::NeuralNetworkSpecValidator::validateFlattenTo2DLayer
          (Result_conflict *__return_storage_ptr__,NeuralNetworkSpecValidator *this,
          NeuralNetworkLayer *layer)

{
  bool bVar1;
  int iVar2;
  Tensor *this_00;
  int64 iVar3;
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8;
  FlattenTo2DLayerParams *pFStack_b0;
  int rank;
  FlattenTo2DLayerParams *params;
  undefined1 local_70 [48];
  Result_conflict r;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  
  r._32_8_ = layer;
  Result::Result((Result *)(local_70 + 0x28));
  validateInputCount((Result_conflict *)local_70,(NeuralNetworkLayer *)r._32_8_,1,1);
  Result::operator=((Result *)(local_70 + 0x28),(Result *)local_70);
  Result::~Result((Result *)local_70);
  bVar1 = Result::good((Result *)(local_70 + 0x28));
  if (bVar1) {
    validateOutputCount((Result_conflict *)&params,(NeuralNetworkLayer *)r._32_8_,1,1);
    Result::operator=((Result *)(local_70 + 0x28),(Result *)&params);
    Result::~Result((Result *)&params);
  }
  pFStack_b0 = Specification::NeuralNetworkLayer::flattento2d((NeuralNetworkLayer *)r._32_8_);
  iVar2 = Specification::NeuralNetworkLayer::inputtensor_size((NeuralNetworkLayer *)r._32_8_);
  if (0 < iVar2) {
    this_00 = Specification::NeuralNetworkLayer::inputtensor((NeuralNetworkLayer *)r._32_8_,0);
    local_d8._M_storage._M_storage._4_4_ = Specification::Tensor::rank(this_00);
    iVar3 = Specification::FlattenTo2DLayerParams::axis(pFStack_b0);
    if ((iVar3 < (int)-local_d8._M_storage._M_storage._4_4_) ||
       (iVar3 = Specification::FlattenTo2DLayerParams::axis(pFStack_b0),
       (int)local_d8._M_storage._M_storage._4_4_ <= iVar3)) {
      __rhs = Specification::NeuralNetworkLayer::name_abi_cxx11_((NeuralNetworkLayer *)r._32_8_);
      std::operator+(&local_f8,
                     "Value of axis must be in the range [-rank(tensor), rank(tensor)) for \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8,
                     &local_f8,"\' layer.");
      std::__cxx11::string::~string((string *)&local_f8);
      Result::Result((Result *)__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      goto LAB_0041a85a;
    }
  }
  Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
LAB_0041a85a:
  Result::~Result((Result *)(local_70 + 0x28));
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateFlattenTo2DLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }
    const auto& params = layer.flattento2d();
    // axis should be in range [-inputRank : inputRank)
    if (layer.inputtensor_size() > 0) {
        const int rank = static_cast<int>(layer.inputtensor(0).rank());
        if (params.axis() < -rank || params.axis() >= rank) {
            const std::string err = "Value of axis must be in the range [-rank(tensor), rank(tensor)) for '" + layer.name() + "' layer.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    return r;
}